

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::ParseSyntaxIdentifier(Parser *this,LocationRecorder *parent)

{
  bool bVar1;
  bool bVar2;
  string syntax;
  LocationRecorder syntax_location;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  Token syntax_token;
  
  LocationRecorder::LocationRecorder(&syntax_location,parent,0xc);
  bVar1 = Consume(this,"syntax",
                  "File must begin with a syntax statement, e.g. \'syntax = \"proto2\";\'.");
  if (bVar1) {
    bVar1 = Consume(this,"=");
    if (bVar1) {
      io::Tokenizer::Token::Token(&syntax_token,&this->input_->current_);
      syntax._M_dataplus._M_p = (pointer)&syntax.field_2;
      syntax._M_string_length = 0;
      syntax.field_2._M_local_buf[0] = '\0';
      bVar1 = ConsumeString(this,&syntax,"Expected syntax identifier.");
      if (bVar1) {
        bVar1 = ConsumeEndOfDeclaration(this,";",&syntax_location);
        if (!bVar1) goto LAB_0034eb94;
        std::__cxx11::string::_M_assign((string *)&this->syntax_identifier_);
        bVar2 = std::operator!=(&syntax,"proto2");
        bVar1 = true;
        if (bVar2) {
          bVar2 = std::operator!=(&syntax,"proto3");
          if ((bVar2) && (this->stop_after_syntax_identifier_ == false)) {
            std::operator+(&local_90,"Unrecognized syntax identifier \"",&syntax);
            std::operator+(&local_70,&local_90,
                           "\".  This parser only recognizes \"proto2\" and \"proto3\".");
            AddError(this,syntax_token.line,syntax_token.column,&local_70);
            std::__cxx11::string::~string((string *)&local_70);
            std::__cxx11::string::~string((string *)&local_90);
            goto LAB_0034eb94;
          }
        }
      }
      else {
LAB_0034eb94:
        bVar1 = false;
      }
      std::__cxx11::string::~string((string *)&syntax);
      std::__cxx11::string::~string((string *)&syntax_token.text);
      goto LAB_0034ebaf;
    }
  }
  bVar1 = false;
LAB_0034ebaf:
  LocationRecorder::~LocationRecorder(&syntax_location);
  return bVar1;
}

Assistant:

bool Parser::ParseSyntaxIdentifier(const LocationRecorder& parent) {
  LocationRecorder syntax_location(parent,
                                   FileDescriptorProto::kSyntaxFieldNumber);
  DO(Consume(
      "syntax",
      "File must begin with a syntax statement, e.g. 'syntax = \"proto2\";'."));
  DO(Consume("="));
  io::Tokenizer::Token syntax_token = input_->current();
  std::string syntax;
  DO(ConsumeString(&syntax, "Expected syntax identifier."));
  DO(ConsumeEndOfDeclaration(";", &syntax_location));

  syntax_identifier_ = syntax;

  if (syntax != "proto2" && syntax != "proto3" &&
      !stop_after_syntax_identifier_) {
    AddError(syntax_token.line, syntax_token.column,
             "Unrecognized syntax identifier \"" + syntax +
                 "\".  This parser "
                 "only recognizes \"proto2\" and \"proto3\".");
    return false;
  }

  return true;
}